

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall
icu_63::CharString::appendInvariantChars(CharString *this,UnicodeString *s,UErrorCode *errorCode)

{
  int32_t ucharsLen;
  char16_t *uchars;
  CharString *pCVar1;
  UErrorCode *errorCode_local;
  UnicodeString *s_local;
  CharString *this_local;
  
  uchars = UnicodeString::getBuffer(s);
  ucharsLen = UnicodeString::length(s);
  pCVar1 = appendInvariantChars(this,uchars,ucharsLen,errorCode);
  return pCVar1;
}

Assistant:

CharString &CharString::appendInvariantChars(const UnicodeString &s, UErrorCode &errorCode) {
    return appendInvariantChars(s.getBuffer(), s.length(), errorCode);
}